

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

Gia_Man_t * Gia_ManFraigReduceGia(Gia_Man_t *p,int *pReprs)

{
  char *pcVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  int iLit1;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  
  if (pReprs == (int *)0x0) {
    __assert_fail("pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x15f,"Gia_Man_t *Gia_ManFraigReduceGia(Gia_Man_t *, int *)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                  ,0x160,"Gia_Man_t *Gia_ManFraigReduceGia(Gia_Man_t *, int *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  Gia_ManFillValue(p);
  Gia_ManHashAlloc(p_00);
  if (0 < p->nObjs) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      pGVar4 = (Gia_Obj_t *)(&pGVar2->field_0x0 + lVar11);
      uVar3 = *(ulong *)pGVar4;
      uVar9 = (uint)uVar3;
      if ((uVar3 & 0x1fffffff) == 0x1fffffff || (int)uVar9 < 0) {
        if ((uVar9 & 0x9fffffff) == 0x9fffffff) {
          pGVar8 = Gia_ManAppendObj(p_00);
          uVar3 = *(ulong *)pGVar8;
          *(ulong *)pGVar8 = uVar3 | 0x9fffffff;
          *(ulong *)pGVar8 =
               uVar3 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar4 = p_00->pObjs;
          if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) {
LAB_0022e00a:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * -0x55555555);
          pGVar4 = p_00->pObjs;
          if ((pGVar8 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar8)) goto LAB_0022e00a;
          iVar5 = (int)((ulong)((long)pGVar8 - (long)pGVar4) >> 2) * 0x55555556;
        }
        else if ((int)uVar9 < 0 && (int)(uVar3 & 0x1fffffff) != 0x1fffffff) {
          iVar5 = Gia_ObjFanin0CopyRepr(p,pGVar4,pReprs);
          iVar5 = Gia_ManAppendCo(p_00,iVar5);
        }
        else {
          iVar5 = 0;
          if ((~uVar3 & 0x1fffffff1fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSweep.c"
                          ,0x170,"Gia_Man_t *Gia_ManFraigReduceGia(Gia_Man_t *, int *)");
          }
        }
      }
      else {
        iVar5 = Gia_ObjFanin0CopyRepr(p,pGVar4,pReprs);
        iLit1 = Gia_ObjFanin1CopyRepr(p,pGVar4,pReprs);
        iVar5 = Gia_ManHashAnd(p_00,iVar5,iLit1);
      }
      *(int *)((long)&pGVar2->Value + lVar11) = iVar5;
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0xc;
    } while (lVar10 < p->nObjs);
  }
  Gia_ManHashStop(p_00);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManFraigReduceGia( Gia_Man_t * p, int * pReprs )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( pReprs != NULL );
    assert( Gia_ManRegNum(p) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0CopyRepr(p, pObj, pReprs), Gia_ObjFanin1CopyRepr(p, pObj, pReprs) );
        else if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0CopyRepr(p, pObj, pReprs) );
        else if ( Gia_ObjIsConst0(pObj) )
            pObj->Value = 0;
        else assert( 0 );
    }
    Gia_ManHashStop( pNew );
    return pNew;
}